

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  UnitTestSource *pUVar5;
  reference pvVar6;
  char *pcVar7;
  UnitTest *pUVar8;
  Fragment<16> *b;
  Fragment<64> *b_00;
  Fragment<2> *b_01;
  Fragment<16> *b_02;
  Fragment<64> *b_03;
  Fragment<196608> *b_04;
  Fragment<1> *b_05;
  Fragment<8192> *b_06;
  Fragment<128> *b_07;
  Fragment<2> *b_08;
  Fragment<16> *b_09;
  Fragment<64> *b_10;
  Fragment<196608> *b_11;
  Fragment<1> *b_12;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> *in_R9;
  unsigned_long *val2;
  Fragment<8192> *pFVar9;
  RepeatCountSet *pRVar10;
  type **in_stack_ffffffffffff71b8;
  AssertionHelper local_84c8;
  Fixed local_8498;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> local_8310;
  undefined1 local_82f0 [8];
  AssertionResult iutest_ar_62;
  Fixed local_8298;
  size_type local_8110;
  char local_8104 [4];
  undefined1 local_8100 [8];
  AssertionResult iutest_ar_61;
  value_type local_80d0;
  undefined1 local_80b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv_6;
  Fixed local_8068;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> local_7ee0;
  undefined1 local_7ec0 [8];
  AssertionResult iutest_ar_60;
  Fixed local_7e68;
  size_type local_7ce0;
  char local_7cd4 [4];
  undefined1 local_7cd0 [8];
  AssertionResult iutest_ar_59;
  value_type local_7ca0;
  undefined1 local_7c80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv_5;
  Fixed local_7c38;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> local_7ab0;
  undefined1 local_7a90 [8];
  AssertionResult iutest_ar_58;
  Fixed local_7a38;
  size_type local_78b0;
  char local_78a4 [4];
  undefined1 local_78a0 [8];
  AssertionResult iutest_ar_57;
  value_type local_7870;
  undefined1 local_7850 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv_4;
  AssertionHelper local_7830;
  Fixed local_7800;
  OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
  local_7678;
  undefined1 local_7658 [8];
  AssertionResult iutest_ar_56;
  Fixed local_7600;
  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> local_7478;
  undefined1 local_7458 [8];
  AssertionResult iutest_ar_55;
  Fixed local_7400;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> local_7278;
  undefined1 local_7258 [8];
  AssertionResult iutest_ar_54;
  Fixed local_7200;
  RepeatCountSet local_7075;
  char local_7074 [4];
  undefined1 local_7070 [8];
  AssertionResult iutest_ar_53;
  Fixed local_7018;
  RandomSeedSet local_6e8d;
  char local_6e8c [4];
  undefined1 local_6e88 [8];
  AssertionResult iutest_ar_52;
  AssertionHelper local_6e40;
  Fixed local_6e10;
  Fragment<8192> local_6c82;
  bool local_6c81;
  undefined1 local_6c80 [8];
  AssertionResult iutest_ar_51;
  AssertionHelper local_6c38;
  Fixed local_6c08;
  undefined1 local_6a79;
  undefined1 local_6a78 [8];
  AssertionResult iutest_ar_50;
  AssertionHelper local_6a30;
  Fixed local_6a00;
  Fragment<4096> local_6872;
  bool local_6871;
  undefined1 local_6870 [8];
  AssertionResult iutest_ar_49;
  AssertionHelper local_6828;
  Fixed local_67f8;
  undefined1 local_6669;
  undefined1 local_6668 [8];
  AssertionResult iutest_ar_48;
  AssertionHelper local_6620;
  Fixed local_65f0;
  undefined1 local_6461;
  undefined1 local_6460 [8];
  AssertionResult iutest_ar_47;
  AssertionHelper local_6418;
  Fixed local_63e8;
  undefined1 local_6259;
  undefined1 local_6258 [8];
  AssertionResult iutest_ar_46;
  AssertionHelper local_6210;
  Fixed local_61e0;
  undefined1 local_6051;
  undefined1 local_6050 [8];
  AssertionResult iutest_ar_45;
  Fixed local_5ff8;
  size_type local_5e70;
  char local_5e64 [4];
  undefined1 local_5e60 [8];
  AssertionResult iutest_ar_44;
  value_type local_5e30;
  allocator<char> local_5e09;
  value_type local_5e08;
  allocator<char> local_5de1;
  value_type local_5de0;
  allocator<char> local_5db9;
  value_type local_5db8;
  allocator<char> local_5d91;
  value_type local_5d90;
  allocator<char> local_5d69;
  value_type local_5d68;
  allocator<char> local_5d41;
  value_type local_5d40;
  allocator<char> local_5d19;
  value_type local_5d18;
  allocator<char> local_5cf1;
  value_type local_5cf0;
  allocator<char> local_5cc9;
  value_type local_5cc8;
  allocator<char> local_5ca1;
  value_type local_5ca0;
  allocator<char> local_5c79;
  value_type local_5c78;
  undefined1 local_5c58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv_3;
  AssertionHelper local_5c20;
  Fixed local_5bf0;
  bool local_5a61;
  undefined1 local_5a60 [8];
  AssertionResult iutest_ar_43;
  Fixed local_5a08;
  OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
  local_5880;
  undefined1 local_5860 [8];
  AssertionResult iutest_ar_42;
  Fixed local_5808;
  OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype> local_5680;
  undefined1 local_5660 [8];
  AssertionResult iutest_ar_41;
  Fixed local_5608;
  OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
  local_5480;
  undefined1 local_5460 [8];
  AssertionResult iutest_ar_40;
  Fixed local_5408;
  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> local_5280;
  undefined1 local_5260 [8];
  AssertionResult iutest_ar_39;
  Fixed local_5208;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> local_5080;
  undefined1 local_5060 [8];
  AssertionResult iutest_ar_38;
  Fixed local_5008;
  RepeatCountSet local_4e7d;
  char local_4e7c [4];
  undefined1 local_4e78 [8];
  AssertionResult iutest_ar_37;
  Fixed local_4e20;
  RandomSeedSet local_4c95;
  char local_4c94 [4];
  undefined1 local_4c90 [8];
  AssertionResult iutest_ar_36;
  AssertionHelper local_4c48;
  Fixed local_4c18;
  undefined1 local_4a89;
  undefined1 local_4a88 [8];
  AssertionResult iutest_ar_35;
  AssertionHelper local_4a40;
  Fixed local_4a10;
  undefined1 local_4881;
  undefined1 local_4880 [8];
  AssertionResult iutest_ar_34;
  AssertionHelper local_4838;
  Fixed local_4808;
  undefined1 local_4679;
  undefined1 local_4678 [8];
  AssertionResult iutest_ar_33;
  AssertionHelper local_4630;
  Fixed local_4600;
  Fragment<4096> local_4472;
  bool local_4471;
  undefined1 local_4470 [8];
  AssertionResult iutest_ar_32;
  AssertionHelper local_4428;
  Fixed local_43f8;
  undefined1 local_4269;
  undefined1 local_4268 [8];
  AssertionResult iutest_ar_31;
  AssertionHelper local_4220;
  Fixed local_41f0;
  undefined1 local_4061;
  undefined1 local_4060 [8];
  AssertionResult iutest_ar_30;
  AssertionHelper local_4018;
  Fixed local_3fe8;
  undefined1 local_3e59;
  undefined1 local_3e58 [8];
  AssertionResult iutest_ar_29;
  AssertionHelper local_3e10;
  Fixed local_3de0;
  undefined1 local_3c51;
  undefined1 local_3c50 [8];
  AssertionResult iutest_ar_28;
  Fixed local_3bf8;
  size_type local_3a70;
  char local_3a64 [4];
  undefined1 local_3a60 [8];
  AssertionResult iutest_ar_27;
  value_type local_3a30;
  allocator<char> local_3a09;
  value_type local_3a08;
  allocator<char> local_39e1;
  value_type local_39e0;
  allocator<char> local_39b9;
  value_type local_39b8;
  allocator<char> local_3991;
  value_type local_3990;
  allocator<char> local_3969;
  value_type local_3968;
  allocator<char> local_3941;
  value_type local_3940;
  allocator<char> local_3919;
  value_type local_3918;
  allocator<char> local_38f1;
  value_type local_38f0;
  allocator<char> local_38c9;
  value_type local_38c8;
  allocator<char> local_38a1;
  value_type local_38a0;
  allocator<char> local_3879;
  value_type local_3878;
  allocator<char> local_3851;
  value_type local_3850;
  allocator<char> local_3829;
  value_type local_3828;
  allocator<char> local_3801;
  value_type local_3800;
  allocator<char> local_37d9;
  value_type local_37d8;
  undefined1 local_37b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv_2;
  AssertionHelper local_3780;
  Fixed local_3750;
  bool local_35c1;
  undefined1 local_35c0 [8];
  AssertionResult iutest_ar_26;
  AssertionHelper local_3578;
  Fixed local_3548;
  bool local_33b9;
  undefined1 local_33b8 [8];
  AssertionResult iutest_ar_25;
  AssertionHelper local_3370;
  Fixed local_3340;
  bool local_31b1;
  undefined1 local_31b0 [8];
  AssertionResult iutest_ar_24;
  Fixed local_3158;
  Fragment<8192> local_2fc9;
  undefined1 local_2fc8 [8];
  AssertionResult iutest_ar_23;
  Fixed local_2f70;
  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> local_2de8;
  undefined1 local_2dc8 [8];
  AssertionResult iutest_ar_22;
  AssertionHelper local_2d80;
  Fixed local_2d50;
  undefined1 local_2bc1;
  undefined1 local_2bc0 [8];
  AssertionResult iutest_ar_21;
  AssertionHelper local_2b78;
  Fixed local_2b48;
  undefined1 local_29b9;
  undefined1 local_29b8 [8];
  AssertionResult iutest_ar_20;
  Fixed local_2960;
  size_type local_27d8;
  char local_27cc [4];
  undefined1 local_27c8 [8];
  AssertionResult iutest_ar_19;
  value_type local_2798;
  allocator<char> local_2771;
  value_type local_2770;
  allocator<char> local_2749;
  value_type local_2748;
  allocator<char> local_2721;
  value_type local_2720;
  undefined1 local_2700 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv_1;
  undefined1 local_26e0 [7];
  bool file_location_msvc;
  Fixed local_26b0;
  int local_2524;
  undefined1 local_2520 [8];
  AssertionResult iutest_ar_18;
  char *targv_6 [2];
  int local_24dc;
  undefined1 local_24d8 [4];
  int targc_7;
  AssertionHelper local_24b8;
  Fixed local_2488;
  bool local_22f9;
  undefined1 local_22f8 [8];
  AssertionResult iutest_ar_17;
  Fixed local_22a0;
  int local_2114;
  undefined1 local_2110 [8];
  AssertionResult iutest_ar_16;
  char *targv_5 [2];
  undefined1 local_20d0 [4];
  int targc_6;
  AssertionHelper local_20b0;
  Fixed local_2080;
  bool local_1ef1;
  undefined1 local_1ef0 [8];
  AssertionResult iutest_ar_15;
  AssertionHelper local_1ec0;
  Fixed local_1e90;
  string local_1d08 [32];
  undefined1 local_1ce8 [8];
  AssertionResult iutest_ar_14;
  Fixed local_1c90;
  string local_1b08 [32];
  undefined1 local_1ae8 [8];
  AssertionResult iutest_ar_13;
  Fixed local_1a90;
  size_type local_1908;
  char local_18fc [4];
  undefined1 local_18f8 [8];
  AssertionResult iutest_ar_12;
  value_type local_18c8;
  allocator<char> local_18a1;
  value_type local_18a0;
  allocator<char> local_1879;
  value_type local_1878;
  undefined1 local_1858 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv;
  Fixed local_1810;
  undefined1 local_1688 [8];
  AssertionResult iutest_ar_11;
  Fixed local_1630;
  undefined1 local_14a8 [8];
  AssertionResult iutest_ar_10;
  Fixed local_1450;
  int local_12c4;
  undefined1 local_12c0 [8];
  AssertionResult iutest_ar_9;
  iu_tchar *targv_4 [4];
  int local_126c;
  undefined1 local_1268 [4];
  int targc_5;
  AssertionHelper local_1248;
  Fixed local_1218;
  bool local_1089;
  undefined1 local_1088 [8];
  AssertionResult iutest_ar_8;
  Fixed local_1030;
  int local_ea4;
  undefined1 local_ea0 [8];
  AssertionResult iutest_ar_7;
  char *targv_3 [2];
  int local_e5c;
  undefined1 local_e58 [4];
  int targc_4;
  AssertionHelper local_e38;
  Fixed local_e08;
  bool local_c79;
  undefined1 local_c78 [8];
  AssertionResult iutest_ar_6;
  Fixed local_c20;
  int local_a94;
  undefined1 local_a90 [8];
  AssertionResult iutest_ar_5;
  char *targv_2 [2];
  int local_a4c;
  undefined1 local_a48 [4];
  int targc_3;
  AssertionHelper local_a28;
  Fixed local_9f8;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult iutest_ar_4;
  Fixed local_810;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> local_688;
  undefined1 local_668 [8];
  AssertionResult iutest_ar_3;
  Fixed local_610;
  int local_484;
  undefined1 local_480 [8];
  AssertionResult iutest_ar_2;
  char *targv_1 [2];
  int local_43c;
  undefined1 local_438 [4];
  int targc_2;
  AssertionHelper local_418;
  Fixed local_3e8;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  Fixed local_200;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult iutest_ar;
  char *targv [2];
  int local_20 [2];
  int targc_1;
  int targc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _targc_1 = argv;
  argv_local._0_4_ = argc;
  iuutil::ReleaseDefaultXmlGenerator();
  local_20[1] = 0;
  iutest::InitIrisUnitTest(local_20 + 1,(nullptr_t)0x0);
  local_20[0] = 2;
  iutest_ar._32_8_ = *_targc_1;
  iutest::InitIrisUnitTest(local_20,(char **)&iutest_ar.m_result);
  iutest::detail::AlwaysZero();
  local_64 = 1;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_60,"1","targc",&local_64,local_20);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_60);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
               ,0x37,pcVar4,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_200);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iVar3 = iutest::UnitTestSource::Run(pUVar5);
  if (iVar3 == 0) {
    iutest::detail::AlwaysZero();
    local_259 = iutest::TestFlag::IsEnableFlag(0x1000000);
    local_259 = !local_259;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_258,&local_259);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      memset(&local_3e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_438,(internal *)local_258,
                 (AssertionResult *)
                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","true","false",
                 (char *)in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                 ,0x3c,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_418,&local_3e8);
      iutest::AssertionHelper::~AssertionHelper(&local_418);
      std::__cxx11::string::~string((string *)local_438);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    local_43c = 2;
    iutest_ar_2._32_8_ = *_targc_1;
    iutest::InitIrisUnitTest(&local_43c,(char **)&iutest_ar_2.m_result);
    iutest::detail::AlwaysZero();
    local_484 = 1;
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_480,"1","targc",&local_484,&local_43c);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
    if (!bVar1) {
      memset(&local_610,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_610);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_480);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                 ,0x41,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_610);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_610);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_480);
    iutest::detail::AlwaysZero();
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>::
    OptionString(&local_688);
    iutest::internal::backward::NeHelper<false>::
    Compare<char[3],iutest::TestEnv::OptionString<&iutest::TestEnv::get_color_option,&iutest::TestEnv::set_color_option>>
              ((AssertionResult *)local_668,(NeHelper<false> *)"\"no\"","::iutest::TestEnv::color()"
               ,"no",(char (*) [3])&local_688,in_R9);
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>::
    ~OptionString(&local_688);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
    if (!bVar1) {
      memset(&local_810,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_810);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_668);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_4.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                 ,0x42,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_810);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_810);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_668);
    pUVar5 = iutest::UnitTestSource::GetInstance();
    iVar3 = iutest::UnitTestSource::Run(pUVar5);
    if (iVar3 == 0) {
      iutest::detail::AlwaysZero();
      local_869 = iutest::TestFlag::IsEnableFlag(0x2000000);
      local_869 = !local_869;
      iutest::AssertionResult::Is<bool>((AssertionResult *)local_868,&local_869);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
      if (!bVar1) {
        memset(&local_9f8,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_9f8);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a48,(internal *)local_868,
                   (AssertionResult *)
                   "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)","true",
                   "false",(char *)in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iutest::AssertionHelper::AssertionHelper
                  (&local_a28,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                   ,0x46,pcVar4,kNonFatalFailure);
        iutest::AssertionHelper::operator=(&local_a28,&local_9f8);
        iutest::AssertionHelper::~AssertionHelper(&local_a28);
        std::__cxx11::string::~string((string *)local_a48);
        iutest::AssertionHelper::Fixed::~Fixed(&local_9f8);
      }
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_868);
      local_a4c = 2;
      iutest_ar_5._32_8_ = *_targc_1;
      iutest::InitIrisUnitTest(&local_a4c,(char **)&iutest_ar_5.m_result);
      iutest::detail::AlwaysZero();
      local_a94 = 1;
      iutest::internal::backward::EqHelper<false>::Compare<int>
                ((AssertionResult *)local_a90,"1","targc",&local_a94,&local_a4c);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
      if (!bVar1) {
        memset(&local_c20,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_c20);
        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_a90);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_ar_6.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                   ,0x4b,pcVar4,kNonFatalFailure);
        iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_c20);
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_c20);
      }
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
      pUVar5 = iutest::UnitTestSource::GetInstance();
      iVar3 = iutest::UnitTestSource::Run(pUVar5);
      if (iVar3 == 0) {
        iutest::detail::AlwaysZero();
        local_c79 = iutest::TestFlag::IsEnableFlag(0x4000000);
        local_c79 = !local_c79;
        iutest::AssertionResult::Is<bool>((AssertionResult *)local_c78,&local_c79);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c78);
        if (!bVar1) {
          memset(&local_e08,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_e08);
          iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e58,(internal *)local_c78,
                     (AssertionResult *)
                     "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","true",
                     "false",(char *)in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iutest::AssertionHelper::AssertionHelper
                    (&local_e38,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                     ,0x4f,pcVar4,kNonFatalFailure);
          iutest::AssertionHelper::operator=(&local_e38,&local_e08);
          iutest::AssertionHelper::~AssertionHelper(&local_e38);
          std::__cxx11::string::~string((string *)local_e58);
          iutest::AssertionHelper::Fixed::~Fixed(&local_e08);
        }
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_c78);
        local_e5c = 2;
        iutest_ar_7._32_8_ = *_targc_1;
        iutest::InitIrisUnitTest(&local_e5c,(char **)&iutest_ar_7.m_result);
        iutest::detail::AlwaysZero();
        local_ea4 = 1;
        iutest::internal::backward::EqHelper<false>::Compare<int>
                  ((AssertionResult *)local_ea0,"1","targc",&local_ea4,&local_e5c);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea0);
        if (!bVar1) {
          memset(&local_1030,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_1030);
          pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_ea0);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_8.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                     ,0x54,pcVar4,kNonFatalFailure);
          iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_1030);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_1030);
        }
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ea0);
        pUVar5 = iutest::UnitTestSource::GetInstance();
        iVar3 = iutest::UnitTestSource::Run(pUVar5);
        if (iVar3 == 0) {
          iutest::detail::AlwaysZero();
          local_1089 = iutest::TestFlag::IsEnableFlag(0x8000000);
          local_1089 = !local_1089;
          iutest::AssertionResult::Is<bool>((AssertionResult *)local_1088,&local_1089);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1088);
          if (!bVar1) {
            memset(&local_1218,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_1218);
            iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                      ((string *)local_1268,(internal *)local_1088,
                       (AssertionResult *)
                       "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","true",
                       "false",(char *)in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iutest::AssertionHelper::AssertionHelper
                      (&local_1248,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x58,pcVar4,kNonFatalFailure);
            iutest::AssertionHelper::operator=(&local_1248,&local_1218);
            iutest::AssertionHelper::~AssertionHelper(&local_1248);
            std::__cxx11::string::~string((string *)local_1268);
            iutest::AssertionHelper::Fixed::~Fixed(&local_1218);
          }
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1088);
          local_126c = 4;
          iutest_ar_9._32_8_ = *_targc_1;
          iutest::InitIrisUnitTest(&local_126c,(char **)&iutest_ar_9.m_result);
          iutest::detail::AlwaysZero();
          local_12c4 = 3;
          iutest::internal::backward::EqHelper<false>::Compare<int>
                    ((AssertionResult *)local_12c0,"3","targc",&local_12c4,&local_126c);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c0);
          if (!bVar1) {
            memset(&local_1450,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_1450);
            pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_12c0);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_10.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x5c,pcVar4,kNonFatalFailure);
            iutest::AssertionHelper::operator=
                      ((AssertionHelper *)&iutest_ar_10.m_result,&local_1450);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_10.m_result);
            iutest::AssertionHelper::Fixed::~Fixed(&local_1450);
          }
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_12c0);
          iutest::detail::AlwaysZero();
          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                    ((AssertionResult *)local_14a8,(internal *)"\"test1\"","targv[1]","test1",
                     "test1",(char *)&iutest_type_traits::enabler_t<void>::value,
                     in_stack_ffffffffffff71b8);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14a8);
          if (!bVar1) {
            memset(&local_1630,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_1630);
            pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_14a8);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_11.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x5d,pcVar4,kNonFatalFailure);
            iutest::AssertionHelper::operator=
                      ((AssertionHelper *)&iutest_ar_11.m_result,&local_1630);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_11.m_result);
            iutest::AssertionHelper::Fixed::~Fixed(&local_1630);
          }
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_14a8);
          iutest::detail::AlwaysZero();
          val2 = &iutest_type_traits::enabler_t<void>::value;
          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                    ((AssertionResult *)local_1688,(internal *)"\"test2\"","targv[2]","test2","-v",
                     (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffff71b8);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1688);
          if (!bVar1) {
            memset(&local_1810,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_1810);
            pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_1688);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)
                       &vargv.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                       ,0x5e,pcVar4,kNonFatalFailure);
            iutest::AssertionHelper::operator=
                      ((AssertionHelper *)
                       &vargv.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1810);
            iutest::AssertionHelper::~AssertionHelper
                      ((AssertionHelper *)
                       &vargv.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iutest::AssertionHelper::Fixed::~Fixed(&local_1810);
          }
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1688);
          pUVar5 = iutest::UnitTestSource::GetInstance();
          iVar3 = iutest::UnitTestSource::Run(pUVar5);
          if (iVar3 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1858);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1878,"test1",&local_1879);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1858,&local_1878);
            std::__cxx11::string::~string((string *)&local_1878);
            std::allocator<char>::~allocator(&local_1879);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_18a0,"-v",&local_18a1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1858,&local_18a0);
            std::__cxx11::string::~string((string *)&local_18a0);
            std::allocator<char>::~allocator(&local_18a1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_18c8,"test2",(allocator<char> *)&iutest_ar_12.field_0x27);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1858,&local_18c8);
            std::__cxx11::string::~string((string *)&local_18c8);
            std::allocator<char>::~allocator((allocator<char> *)&iutest_ar_12.field_0x27);
            iutest::InitIrisUnitTest<char>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1858);
            iutest::detail::AlwaysZero();
            local_18fc[0] = '\x02';
            local_18fc[1] = '\0';
            local_18fc[2] = '\0';
            local_18fc[3] = '\0';
            local_1908 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_1858);
            iutest::internal::backward::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                      ((AssertionResult *)local_18f8,(EqHelper<false> *)"2u","vargv.size()",
                       local_18fc,(uint *)&local_1908,val2);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18f8);
            if (!bVar1) {
              memset(&local_1a90,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_1a90);
              pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_18f8);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_13.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                         ,0x67,pcVar4,kNonFatalFailure);
              iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_ar_13.m_result,&local_1a90);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_13.m_result);
              iutest::AssertionHelper::Fixed::~Fixed(&local_1a90);
            }
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_18f8);
            iutest::detail::AlwaysZero();
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1858,0);
            std::__cxx11::string::string(local_1b08,(string *)pvVar6);
            iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                      ((AssertionResult *)local_1ae8,(internal *)"\"test1\"","vargv[0]","test1",
                       (char *)local_1b08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffff71b8);
            std::__cxx11::string::~string(local_1b08);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ae8);
            if (!bVar1) {
              memset(&local_1c90,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_1c90);
              pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_1ae8);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_14.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                         ,0x68,pcVar4,kNonFatalFailure);
              iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_ar_14.m_result,&local_1c90);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_14.m_result);
              iutest::AssertionHelper::Fixed::~Fixed(&local_1c90);
            }
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1ae8);
            iutest::detail::AlwaysZero();
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1858,1);
            std::__cxx11::string::string(local_1d08,(string *)pvVar6);
            pcVar4 = (char *)&iutest_type_traits::enabler_t<void>::value;
            iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                      ((AssertionResult *)local_1ce8,(internal *)"\"test2\"","vargv[1]","test2",
                       (char *)local_1d08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffff71b8);
            std::__cxx11::string::~string(local_1d08);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ce8);
            if (!bVar1) {
              memset(&local_1e90,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_1e90);
              pcVar7 = iutest::AssertionResult::message((AssertionResult *)local_1ce8);
              iutest::AssertionHelper::AssertionHelper
                        (&local_1ec0,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                         ,0x69,pcVar7,kNonFatalFailure);
              iutest::AssertionHelper::operator=(&local_1ec0,&local_1e90);
              iutest::AssertionHelper::~AssertionHelper(&local_1ec0);
              iutest::AssertionHelper::Fixed::~Fixed(&local_1e90);
            }
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1ce8);
            pUVar5 = iutest::UnitTestSource::GetInstance();
            iVar3 = iutest::UnitTestSource::Run(pUVar5);
            if (iVar3 != 0) {
              argv_local._4_4_ = 1;
            }
            iutest_ar_15._37_3_ = 0;
            iutest_ar_15._36_1_ = iVar3 != 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1858);
            if (iutest_ar_15._36_4_ == 0) {
              iutest::detail::AlwaysZero();
              local_1ef1 = iutest::TestFlag::IsEnableFlag(0x2000000);
              local_1ef1 = !local_1ef1;
              iutest::AssertionResult::Is<bool>((AssertionResult *)local_1ef0,&local_1ef1);
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ef0);
              if (!bVar1) {
                memset(&local_2080,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_2080);
                iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                          ((string *)local_20d0,(internal *)local_1ef0,
                           (AssertionResult *)
                           "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)",
                           "true","false",pcVar4);
                pcVar7 = (char *)std::__cxx11::string::c_str();
                iutest::AssertionHelper::AssertionHelper
                          (&local_20b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                           ,0x6e,pcVar7,kNonFatalFailure);
                iutest::AssertionHelper::operator=(&local_20b0,&local_2080);
                iutest::AssertionHelper::~AssertionHelper(&local_20b0);
                std::__cxx11::string::~string((string *)local_20d0);
                iutest::AssertionHelper::Fixed::~Fixed(&local_2080);
              }
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1ef0);
              targv_5[1]._4_4_ = 2;
              iutest_ar_16._32_8_ = *_targc_1;
              targv_5[0] = "-h";
              iutest::InitIrisUnitTest((int *)((long)targv_5 + 0xc),(char **)&iutest_ar_16.m_result)
              ;
              iutest::detail::AlwaysZero();
              local_2114 = 1;
              iutest::internal::backward::EqHelper<false>::Compare<int>
                        ((AssertionResult *)local_2110,"1","targc",&local_2114,
                         (int *)((long)targv_5 + 0xc));
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2110);
              if (!bVar1) {
                memset(&local_22a0,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_22a0);
                pcVar7 = iutest::AssertionResult::message((AssertionResult *)local_2110);
                iutest::AssertionHelper::AssertionHelper
                          ((AssertionHelper *)&iutest_ar_17.m_result,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                           ,0x73,pcVar7,kNonFatalFailure);
                iutest::AssertionHelper::operator=
                          ((AssertionHelper *)&iutest_ar_17.m_result,&local_22a0);
                iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_17.m_result)
                ;
                iutest::AssertionHelper::Fixed::~Fixed(&local_22a0);
              }
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2110);
              pUVar5 = iutest::UnitTestSource::GetInstance();
              iVar3 = iutest::UnitTestSource::Run(pUVar5);
              if (iVar3 == 0) {
                iutest::detail::AlwaysZero();
                local_22f9 = iutest::TestFlag::IsEnableFlag(0x1000000);
                local_22f9 = !local_22f9;
                iutest::AssertionResult::Is<bool>((AssertionResult *)local_22f8,&local_22f9);
                bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_22f8);
                if (!bVar1) {
                  memset(&local_2488,0,0x188);
                  iutest::AssertionHelper::Fixed::Fixed(&local_2488);
                  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                            ((string *)local_24d8,(internal *)local_22f8,
                             (AssertionResult *)
                             "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
                             "true","false",pcVar4);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  iutest::AssertionHelper::AssertionHelper
                            (&local_24b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                             ,0x77,pcVar4,kNonFatalFailure);
                  iutest::AssertionHelper::operator=(&local_24b8,&local_2488);
                  iutest::AssertionHelper::~AssertionHelper(&local_24b8);
                  std::__cxx11::string::~string((string *)local_24d8);
                  iutest::AssertionHelper::Fixed::~Fixed(&local_2488);
                }
                iutest::AssertionResult::~AssertionResult((AssertionResult *)local_22f8);
                local_24dc = 2;
                iutest_ar_18._32_8_ = *_targc_1;
                iutest::InitIrisUnitTest(&local_24dc,(char **)&iutest_ar_18.m_result);
                iutest::detail::AlwaysZero();
                local_2524 = 1;
                iutest::internal::backward::EqHelper<false>::Compare<int>
                          ((AssertionResult *)local_2520,"1","targc",&local_2524,&local_24dc);
                bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2520);
                if (!bVar1) {
                  memset(&local_26b0,0,0x188);
                  iutest::AssertionHelper::Fixed::Fixed(&local_26b0);
                  pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_2520);
                  iutest::AssertionHelper::AssertionHelper
                            ((AssertionHelper *)local_26e0,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                             ,0x7c,pcVar4,kNonFatalFailure);
                  iutest::AssertionHelper::operator=((AssertionHelper *)local_26e0,&local_26b0);
                  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_26e0);
                  iutest::AssertionHelper::Fixed::~Fixed(&local_26b0);
                }
                iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2520);
                pUVar5 = iutest::UnitTestSource::GetInstance();
                iVar3 = iutest::UnitTestSource::Run(pUVar5);
                if (iVar3 == 0) {
                  pFVar9 = (Fragment<8192> *)
                           ((long)&vargv_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
                  iutest::TestFlag::Fragment<8192>::Fragment(pFVar9);
                  vargv_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                       iutest::TestFlag::Fragment::operator_cast_to_bool((Fragment *)pFVar9);
                  bVar2 = ~vargv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
                  pFVar9 = (Fragment<8192> *)
                           ((long)&vargv_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
                  iutest::TestFlag::Fragment<8192>::Fragment(pFVar9);
                  iutest::TestFlag::Fragment<8192>::operator=(pFVar9,(bool)(bVar2 & 1));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2700);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2720,"--iutest_break_on_failure",&local_2721);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2700,&local_2720);
                  std::__cxx11::string::~string((string *)&local_2720);
                  std::allocator<char>::~allocator(&local_2721);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2748,"--iutest_throw_on_failure",&local_2749);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2700,&local_2748);
                  std::__cxx11::string::~string((string *)&local_2748);
                  std::allocator<char>::~allocator(&local_2749);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2770,"--iutest_filter",&local_2771);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2700,&local_2770);
                  std::__cxx11::string::~string((string *)&local_2770);
                  std::allocator<char>::~allocator(&local_2771);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2798,"--iutest_file_location=auto",
                             (allocator<char> *)&iutest_ar_19.field_0x27);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2700,&local_2798);
                  std::__cxx11::string::~string((string *)&local_2798);
                  std::allocator<char>::~allocator((allocator<char> *)&iutest_ar_19.field_0x27);
                  iutest::InitIrisUnitTest<char>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2700);
                  iutest::detail::AlwaysZero();
                  local_27cc[0] = '\0';
                  local_27cc[1] = '\0';
                  local_27cc[2] = '\0';
                  local_27cc[3] = '\0';
                  local_27d8 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_2700);
                  pcVar4 = (char *)&iutest_type_traits::enabler_t<void>::value;
                  iutest::internal::backward::EqHelper<true>::Compare<unsigned_int,unsigned_long>
                            ((AssertionResult *)local_27c8,(EqHelper<true> *)0x1586ce,"vargv.size()"
                             ,local_27cc,(uint *)&local_27d8,
                             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffff71b8);
                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_27c8);
                  if (!bVar1) {
                    memset(&local_2960,0,0x188);
                    iutest::AssertionHelper::Fixed::Fixed(&local_2960);
                    pcVar7 = iutest::AssertionResult::message((AssertionResult *)local_27c8);
                    iutest::AssertionHelper::AssertionHelper
                              ((AssertionHelper *)&iutest_ar_20.m_result,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8a,pcVar7,kNonFatalFailure);
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&iutest_ar_20.m_result,&local_2960);
                    iutest::AssertionHelper::~AssertionHelper
                              ((AssertionHelper *)&iutest_ar_20.m_result);
                    iutest::AssertionHelper::Fixed::~Fixed(&local_2960);
                  }
                  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_27c8);
                  iutest::detail::AlwaysZero();
                  iutest::TestFlag::Fragment<16>::Fragment((Fragment<16> *)&local_29b9);
                  iutest::AssertionResult::Is<iutest::TestFlag::Fragment<16>>
                            ((AssertionResult *)local_29b8,(AssertionResult *)&local_29b9,b);
                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_29b8);
                  if (!bVar1) {
                    memset(&local_2b48,0,0x188);
                    iutest::AssertionHelper::Fixed::Fixed(&local_2b48);
                    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                              ((string *)&iutest_ar_21.m_result,(internal *)local_29b8,
                               (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false","true"
                               ,pcVar4);
                    pcVar7 = (char *)std::__cxx11::string::c_str();
                    iutest::AssertionHelper::AssertionHelper
                              (&local_2b78,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8c,pcVar7,kNonFatalFailure);
                    iutest::AssertionHelper::operator=(&local_2b78,&local_2b48);
                    iutest::AssertionHelper::~AssertionHelper(&local_2b78);
                    std::__cxx11::string::~string((string *)&iutest_ar_21.m_result);
                    iutest::AssertionHelper::Fixed::~Fixed(&local_2b48);
                  }
                  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_29b8);
                  iutest::detail::AlwaysZero();
                  iutest::TestFlag::Fragment<64>::Fragment((Fragment<64> *)&local_2bc1);
                  iutest::AssertionResult::Is<iutest::TestFlag::Fragment<64>>
                            ((AssertionResult *)local_2bc0,(AssertionResult *)&local_2bc1,b_00);
                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2bc0);
                  if (!bVar1) {
                    memset(&local_2d50,0,0x188);
                    iutest::AssertionHelper::Fixed::Fixed(&local_2d50);
                    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                              ((string *)&iutest_ar_22.m_result,(internal *)local_2bc0,
                               (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false","true"
                               ,pcVar4);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    iutest::AssertionHelper::AssertionHelper
                              (&local_2d80,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8d,pcVar4,kNonFatalFailure);
                    iutest::AssertionHelper::operator=(&local_2d80,&local_2d50);
                    iutest::AssertionHelper::~AssertionHelper(&local_2d80);
                    std::__cxx11::string::~string((string *)&iutest_ar_22.m_result);
                    iutest::AssertionHelper::Fixed::~Fixed(&local_2d50);
                  }
                  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2bc0);
                  iutest::detail::AlwaysZero();
                  iutest::TestEnv::
                  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                  OptionString(&local_2de8);
                  pcVar4 = iutest::TestEnv::
                           OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                           ::c_str(&local_2de8);
                  pFVar9 = (Fragment<8192> *)&iutest_type_traits::enabler_t<void>::value;
                  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                            ((AssertionResult *)local_2dc8,(internal *)"\"*\"",
                             "::iutest::TestEnv::filter().c_str()","*",pcVar4,
                             (char *)&iutest_type_traits::enabler_t<void>::value,
                             in_stack_ffffffffffff71b8);
                  iutest::TestEnv::
                  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                  ~OptionString(&local_2de8);
                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2dc8);
                  if (!bVar1) {
                    memset(&local_2f70,0,0x188);
                    iutest::AssertionHelper::Fixed::Fixed(&local_2f70);
                    pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_2dc8);
                    iutest::AssertionHelper::AssertionHelper
                              ((AssertionHelper *)&iutest_ar_23.m_result,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8e,pcVar4,kNonFatalFailure);
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&iutest_ar_23.m_result,&local_2f70);
                    iutest::AssertionHelper::~AssertionHelper
                              ((AssertionHelper *)&iutest_ar_23.m_result);
                    iutest::AssertionHelper::Fixed::~Fixed(&local_2f70);
                  }
                  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2dc8);
                  iutest::detail::AlwaysZero();
                  iutest::TestFlag::Fragment<8192>::Fragment(&local_2fc9);
                  iutest::internal::backward::EqHelper<false>::
                  Compare<bool,iutest::TestFlag::Fragment<8192>>
                            ((AssertionResult *)local_2fc8,(EqHelper<false> *)"file_location_msvc",
                             "::iutest::TestEnv::file_location_style_msvc()",
                             (char *)((long)&vargv_1.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)
                             ,(bool *)&local_2fc9,pFVar9);
                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2fc8);
                  if (!bVar1) {
                    memset(&local_3158,0,0x188);
                    iutest::AssertionHelper::Fixed::Fixed(&local_3158);
                    pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_2fc8);
                    iutest::AssertionHelper::AssertionHelper
                              ((AssertionHelper *)&iutest_ar_24.m_result,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                               ,0x8f,pcVar4,kNonFatalFailure);
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&iutest_ar_24.m_result,&local_3158);
                    iutest::AssertionHelper::~AssertionHelper
                              ((AssertionHelper *)&iutest_ar_24.m_result);
                    iutest::AssertionHelper::Fixed::~Fixed(&local_3158);
                  }
                  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2fc8);
                  pUVar8 = iutest::UnitTest::GetInstance();
                  iutest_ar_15._36_1_ = iutest::UnitTest::Failed(pUVar8);
                  if ((bool)iutest_ar_15._36_1_) {
                    argv_local._4_4_ = 1;
                  }
                  iutest_ar_15._37_3_ = 0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2700);
                  if (iutest_ar_15._36_4_ == 0) {
                    iutest::detail::AlwaysZero();
                    local_31b1 = iutest::TestFlag::IsEnableFlag(0x1000000);
                    local_31b1 = !local_31b1;
                    iutest::AssertionResult::Is<bool>((AssertionResult *)local_31b0,&local_31b1);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_31b0);
                    if (!bVar1) {
                      memset(&local_3340,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_3340);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_25.m_result,(internal *)local_31b0,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
                                 "true","false",(char *)pFVar9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_3370,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0x95,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_3370,&local_3340);
                      iutest::AssertionHelper::~AssertionHelper(&local_3370);
                      std::__cxx11::string::~string((string *)&iutest_ar_25.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_3340);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_31b0);
                    iutest::detail::AlwaysZero();
                    local_33b9 = iutest::TestFlag::IsEnableFlag(0x4000000);
                    local_33b9 = !local_33b9;
                    iutest::AssertionResult::Is<bool>((AssertionResult *)local_33b8,&local_33b9);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_33b8);
                    if (!bVar1) {
                      memset(&local_3548,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_3548);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_26.m_result,(internal *)local_33b8,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)"
                                 ,"true","false",(char *)pFVar9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_3578,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0x96,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_3578,&local_3548);
                      iutest::AssertionHelper::~AssertionHelper(&local_3578);
                      std::__cxx11::string::~string((string *)&iutest_ar_26.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_3548);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_33b8);
                    iutest::detail::AlwaysZero();
                    local_35c1 = iutest::TestFlag::IsEnableFlag(0x2000000);
                    local_35c1 = !local_35c1;
                    iutest::AssertionResult::Is<bool>((AssertionResult *)local_35c0,&local_35c1);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_35c0);
                    if (!bVar1) {
                      memset(&local_3750,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_3750);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)
                                 &vargv_2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (internal *)local_35c0,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)"
                                 ,"true","false",(char *)pFVar9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_3780,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0x97,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_3780,&local_3750);
                      iutest::AssertionHelper::~AssertionHelper(&local_3780);
                      std::__cxx11::string::~string
                                ((string *)
                                 &vargv_2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_3750);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_35c0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_37b8);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_37d8,"--iutest_break_on_failure=1",&local_37d9);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_37d8);
                    std::__cxx11::string::~string((string *)&local_37d8);
                    std::allocator<char>::~allocator(&local_37d9);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3800,"--iutest_throw_on_failure=t",&local_3801);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3800);
                    std::__cxx11::string::~string((string *)&local_3800);
                    std::allocator<char>::~allocator(&local_3801);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3828,"--iutest_also_run_disabled_tests",&local_3829)
                    ;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3828);
                    std::__cxx11::string::~string((string *)&local_3828);
                    std::allocator<char>::~allocator(&local_3829);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3850,"--iutest_catch_exceptions=yes",&local_3851);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3850);
                    std::__cxx11::string::~string((string *)&local_3850);
                    std::allocator<char>::~allocator(&local_3851);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3878,"--iutest_print_time=n",&local_3879);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3878);
                    std::__cxx11::string::~string((string *)&local_3878);
                    std::allocator<char>::~allocator(&local_3879);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_38a0,"--iutest_shuffle",&local_38a1);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_38a0);
                    std::__cxx11::string::~string((string *)&local_38a0);
                    std::allocator<char>::~allocator(&local_38a1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_38c8,"--iutest_color=ansi",&local_38c9);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_38c8);
                    std::__cxx11::string::~string((string *)&local_38c8);
                    std::allocator<char>::~allocator(&local_38c9);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_38f0,"--iutest_file_location=vs",&local_38f1);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_38f0);
                    std::__cxx11::string::~string((string *)&local_38f0);
                    std::allocator<char>::~allocator(&local_38f1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3918,"--iutest_random_seed=200",&local_3919);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3918);
                    std::__cxx11::string::~string((string *)&local_3918);
                    std::allocator<char>::~allocator(&local_3919);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3940,"--iutest_repeat=2",&local_3941);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3940);
                    std::__cxx11::string::~string((string *)&local_3940);
                    std::allocator<char>::~allocator(&local_3941);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3968,"--iutest_filter=Flag*",&local_3969);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3968);
                    std::__cxx11::string::~string((string *)&local_3968);
                    std::allocator<char>::~allocator(&local_3969);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3990,"--iutest_default_package_name=root",
                               &local_3991);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3990);
                    std::__cxx11::string::~string((string *)&local_3990);
                    std::allocator<char>::~allocator(&local_3991);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_39b8,"--iutest_warning_into_error=t",&local_39b9);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_39b8);
                    std::__cxx11::string::~string((string *)&local_39b8);
                    std::allocator<char>::~allocator(&local_39b9);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_39e0,"--iutest_locale_ctype=C",&local_39e1);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_39e0);
                    std::__cxx11::string::~string((string *)&local_39e0);
                    std::allocator<char>::~allocator(&local_39e1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3a08,"--iutest_stream_result_to=test",&local_3a09);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3a08);
                    std::__cxx11::string::~string((string *)&local_3a08);
                    std::allocator<char>::~allocator(&local_3a09);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3a30,"--verbose",
                               (allocator<char> *)&iutest_ar_27.field_0x27);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_37b8,&local_3a30);
                    std::__cxx11::string::~string((string *)&local_3a30);
                    std::allocator<char>::~allocator((allocator<char> *)&iutest_ar_27.field_0x27);
                    iutest::InitIrisUnitTest<char>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_37b8);
                    iutest::detail::AlwaysZero();
                    local_3a64[0] = '\0';
                    local_3a64[1] = '\0';
                    local_3a64[2] = '\0';
                    local_3a64[3] = '\0';
                    local_3a70 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_37b8);
                    pRVar10 = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
                    iutest::internal::backward::EqHelper<true>::Compare<unsigned_int,unsigned_long>
                              ((AssertionResult *)local_3a60,(EqHelper<true> *)0x1586ce,
                               "vargv.size()",local_3a64,(uint *)&local_3a70,
                               &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffff71b8
                              );
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_3a60);
                    if (!bVar1) {
                      memset(&local_3bf8,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_3bf8);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_3a60);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_28.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xae,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_28.m_result,&local_3bf8);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_28.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_3bf8);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3a60);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<2>::Fragment((Fragment<2> *)&local_3c51);
                    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<2>>
                              ((AssertionResult *)local_3c50,(AssertionResult *)&local_3c51,b_01);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_3c50);
                    if (!bVar1) {
                      memset(&local_3de0,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_3de0);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_29.m_result,(internal *)local_3c50,
                                 (AssertionResult *)"IUTEST_FLAG_GET(also_run_disabled_tests)",
                                 "false","true",(char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_3e10,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb0,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_3e10,&local_3de0);
                      iutest::AssertionHelper::~AssertionHelper(&local_3e10);
                      std::__cxx11::string::~string((string *)&iutest_ar_29.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_3de0);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3c50);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<16>::Fragment((Fragment<16> *)&local_3e59);
                    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<16>>
                              ((AssertionResult *)local_3e58,(AssertionResult *)&local_3e59,b_02);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_3e58);
                    if (!bVar1) {
                      memset(&local_3fe8,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_3fe8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_30.m_result,(internal *)local_3e58,
                                 (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false",
                                 "true",(char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_4018,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb1,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_4018,&local_3fe8);
                      iutest::AssertionHelper::~AssertionHelper(&local_4018);
                      std::__cxx11::string::~string((string *)&iutest_ar_30.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_3fe8);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3e58);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<64>::Fragment((Fragment<64> *)&local_4061);
                    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<64>>
                              ((AssertionResult *)local_4060,(AssertionResult *)&local_4061,b_03);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4060);
                    if (!bVar1) {
                      memset(&local_41f0,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_41f0);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_31.m_result,(internal *)local_4060,
                                 (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false",
                                 "true",(char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_4220,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb2,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_4220,&local_41f0);
                      iutest::AssertionHelper::~AssertionHelper(&local_4220);
                      std::__cxx11::string::~string((string *)&iutest_ar_31.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_41f0);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4060);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<196608>::Fragment((Fragment<196608> *)&local_4269);
                    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<196608>>
                              ((AssertionResult *)local_4268,(AssertionResult *)&local_4269,b_04);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4268);
                    if (!bVar1) {
                      memset(&local_43f8,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_43f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_32.m_result,(internal *)local_4268,
                                 (AssertionResult *)"IUTEST_FLAG_GET(catch_exceptions)","false",
                                 "true",(char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_4428,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb3,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_4428,&local_43f8);
                      iutest::AssertionHelper::~AssertionHelper(&local_4428);
                      std::__cxx11::string::~string((string *)&iutest_ar_32.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_43f8);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4268);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<4096>::Fragment(&local_4472);
                    bVar1 = iutest::TestFlag::Fragment::operator_cast_to_bool
                                      ((Fragment *)&local_4472);
                    local_4471 = (bool)(~bVar1 & 1);
                    iutest::AssertionResult::Is<bool>((AssertionResult *)local_4470,&local_4471);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4470);
                    if (!bVar1) {
                      memset(&local_4600,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_4600);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_33.m_result,(internal *)local_4470,
                                 (AssertionResult *)"IUTEST_FLAG_GET(print_time)","true","false",
                                 (char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_4630,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb4,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_4630,&local_4600);
                      iutest::AssertionHelper::~AssertionHelper(&local_4630);
                      std::__cxx11::string::~string((string *)&iutest_ar_33.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_4600);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4470);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<1>::Fragment((Fragment<1> *)&local_4679);
                    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<1>>
                              ((AssertionResult *)local_4678,(AssertionResult *)&local_4679,b_05);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4678);
                    if (!bVar1) {
                      memset(&local_4808,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_4808);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_34.m_result,(internal *)local_4678,
                                 (AssertionResult *)"IUTEST_FLAG_GET(shuffle)","false","true",
                                 (char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_4838,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb5,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_4838,&local_4808);
                      iutest::AssertionHelper::~AssertionHelper(&local_4838);
                      std::__cxx11::string::~string((string *)&iutest_ar_34.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_4808);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4678);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<8192>::Fragment((Fragment<8192> *)&local_4881);
                    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<8192>>
                              ((AssertionResult *)local_4880,(AssertionResult *)&local_4881,b_06);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4880);
                    if (!bVar1) {
                      memset(&local_4a10,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_4a10);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_35.m_result,(internal *)local_4880,
                                 (AssertionResult *)"IUTEST_FLAG_GET(file_location_style_msvc)",
                                 "false","true",(char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_4a40,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb6,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_4a40,&local_4a10);
                      iutest::AssertionHelper::~AssertionHelper(&local_4a40);
                      std::__cxx11::string::~string((string *)&iutest_ar_35.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_4a10);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4880);
                    iutest::detail::AlwaysZero();
                    iutest::TestFlag::Fragment<128>::Fragment((Fragment<128> *)&local_4a89);
                    iutest::AssertionResult::Is<iutest::TestFlag::Fragment<128>>
                              ((AssertionResult *)local_4a88,(AssertionResult *)&local_4a89,b_07);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4a88);
                    if (!bVar1) {
                      memset(&local_4c18,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_4c18);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)&iutest_ar_36.m_result,(internal *)local_4a88,
                                 (AssertionResult *)"IUTEST_FLAG_GET(warning_into_error)","false",
                                 "true",(char *)pRVar10);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_4c48,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb7,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_4c48,&local_4c18);
                      iutest::AssertionHelper::~AssertionHelper(&local_4c48);
                      std::__cxx11::string::~string((string *)&iutest_ar_36.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_4c18);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4a88);
                    iutest::detail::AlwaysZero();
                    local_4c94[0] = -0x38;
                    local_4c94[1] = '\0';
                    local_4c94[2] = '\0';
                    local_4c94[3] = '\0';
                    iutest::TestEnv::RandomSeedSet::RandomSeedSet(&local_4c95);
                    iutest::internal::backward::EqHelper<false>::
                    Compare<unsigned_int,iutest::TestEnv::RandomSeedSet>
                              ((AssertionResult *)local_4c90,(EqHelper<false> *)"200u",
                               "::iutest::TestEnv::random_seed()",local_4c94,(uint *)&local_4c95,
                               (RandomSeedSet *)pRVar10);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4c90);
                    if (!bVar1) {
                      memset(&local_4e20,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_4e20);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_4c90);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_37.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xb9,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_37.m_result,&local_4e20);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_37.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_4e20);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4c90);
                    iutest::detail::AlwaysZero();
                    local_4e7c[0] = '\x02';
                    local_4e7c[1] = '\0';
                    local_4e7c[2] = '\0';
                    local_4e7c[3] = '\0';
                    iutest::TestEnv::RepeatCountSet::RepeatCountSet(&local_4e7d);
                    iutest::internal::backward::EqHelper<false>::
                    Compare<int,iutest::TestEnv::RepeatCountSet>
                              ((AssertionResult *)local_4e78,(EqHelper<false> *)0x158906,
                               "::iutest::TestEnv::repeat()",local_4e7c,(int *)&local_4e7d,pRVar10);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4e78);
                    if (!bVar1) {
                      memset(&local_5008,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_5008);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_4e78);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_38.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xba,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_38.m_result,&local_5008);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_38.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_5008);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4e78);
                    iutest::detail::AlwaysZero();
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                    ::OptionString(&local_5080);
                    pcVar4 = iutest::TestEnv::
                             OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                             ::c_str(&local_5080);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              ((AssertionResult *)local_5060,(internal *)"\"ansi\"",
                               "::iutest::TestEnv::color().c_str()","ansi",pcVar4,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_ffffffffffff71b8);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                    ::~OptionString(&local_5080);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_5060);
                    if (!bVar1) {
                      memset(&local_5208,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_5208);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_5060);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_39.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbc,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_39.m_result,&local_5208);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_39.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_5208);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5060);
                    iutest::detail::AlwaysZero();
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                    OptionString(&local_5280);
                    pcVar4 = iutest::TestEnv::
                             OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                             ::c_str(&local_5280);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              ((AssertionResult *)local_5260,(internal *)"\"Flag*\"",
                               "::iutest::TestEnv::filter().c_str()","Flag*",pcVar4,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_ffffffffffff71b8);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                    ~OptionString(&local_5280);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_5260);
                    if (!bVar1) {
                      memset(&local_5408,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_5408);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_5260);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_40.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbd,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_40.m_result,&local_5408);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_40.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_5408);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5260);
                    iutest::detail::AlwaysZero();
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                    ::OptionString(&local_5480);
                    pcVar4 = iutest::TestEnv::
                             OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                             ::c_str(&local_5480);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              ((AssertionResult *)local_5460,(internal *)"\"root\"",
                               "::iutest::TestEnv::default_package_name().c_str()","root",pcVar4,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_ffffffffffff71b8);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                    ::~OptionString(&local_5480);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_5460);
                    if (!bVar1) {
                      memset(&local_5608,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_5608);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_5460);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_41.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbe,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_41.m_result,&local_5608);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_41.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_5608);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5460);
                    iutest::detail::AlwaysZero();
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype>
                    ::OptionString(&local_5680);
                    pcVar4 = iutest::TestEnv::
                             OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype>
                             ::c_str(&local_5680);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              ((AssertionResult *)local_5660,(internal *)"\"C\"",
                               "::iutest::TestEnv::locale_ctype().c_str()","C",pcVar4,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_ffffffffffff71b8);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype>
                    ::~OptionString(&local_5680);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_5660);
                    if (!bVar1) {
                      memset(&local_5808,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_5808);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_5660);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_42.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xbf,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_42.m_result,&local_5808);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_42.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_5808);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5660);
                    iutest::detail::AlwaysZero();
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
                    ::OptionString(&local_5880);
                    pcVar4 = iutest::TestEnv::
                             OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
                             ::c_str(&local_5880);
                    pcVar7 = (char *)&iutest_type_traits::enabler_t<void>::value;
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              ((AssertionResult *)local_5860,(internal *)"\"test\"",
                               "::iutest::TestEnv::stream_result_to().c_str()","test",pcVar4,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_ffffffffffff71b8);
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
                    ::~OptionString(&local_5880);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_5860);
                    if (!bVar1) {
                      memset(&local_5a08,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_5a08);
                      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_5860);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_ar_43.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xc1,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_ar_43.m_result,&local_5a08);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_ar_43.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_5a08);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5860);
                    iutest::detail::AlwaysZero();
                    local_5a61 = iutest::TestFlag::IsEnableFlag(0x4000);
                    iutest::AssertionResult::Is<bool>((AssertionResult *)local_5a60,&local_5a61);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_5a60);
                    if (!bVar1) {
                      memset(&local_5bf0,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_5bf0);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)
                                 &vargv_3.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (internal *)local_5a60,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::VERBOSE)",
                                 "false","true",pcVar7);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iutest::AssertionHelper::AssertionHelper
                                (&local_5c20,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                 ,0xc3,pcVar4,kNonFatalFailure);
                      iutest::AssertionHelper::operator=(&local_5c20,&local_5bf0);
                      iutest::AssertionHelper::~AssertionHelper(&local_5c20);
                      std::__cxx11::string::~string
                                ((string *)
                                 &vargv_3.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_5bf0);
                    }
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5a60);
                    pUVar8 = iutest::UnitTest::GetInstance();
                    iutest_ar_15._36_1_ = iutest::UnitTest::Failed(pUVar8);
                    if ((bool)iutest_ar_15._36_1_) {
                      argv_local._4_4_ = 1;
                    }
                    iutest_ar_15._37_3_ = 0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_37b8);
                    if (iutest_ar_15._36_4_ == 0) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_5c58);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5c78,"--gtest_break_on_failure=1",&local_5c79);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5c78);
                      std::__cxx11::string::~string((string *)&local_5c78);
                      std::allocator<char>::~allocator(&local_5c79);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5ca0,"--gtest_throw_on_failure=t",&local_5ca1);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5ca0);
                      std::__cxx11::string::~string((string *)&local_5ca0);
                      std::allocator<char>::~allocator(&local_5ca1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5cc8,"--gtest_also_run_disabled_tests",&local_5cc9
                                );
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5cc8);
                      std::__cxx11::string::~string((string *)&local_5cc8);
                      std::allocator<char>::~allocator(&local_5cc9);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5cf0,"--gtest_catch_exceptions=yes",&local_5cf1);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5cf0);
                      std::__cxx11::string::~string((string *)&local_5cf0);
                      std::allocator<char>::~allocator(&local_5cf1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5d18,"--gtest_print_time=n",&local_5d19);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5d18);
                      std::__cxx11::string::~string((string *)&local_5d18);
                      std::allocator<char>::~allocator(&local_5d19);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5d40,"--gtest_shuffle",&local_5d41);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5d40);
                      std::__cxx11::string::~string((string *)&local_5d40);
                      std::allocator<char>::~allocator(&local_5d41);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5d68,"--gtest_color=ansi",&local_5d69);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5d68);
                      std::__cxx11::string::~string((string *)&local_5d68);
                      std::allocator<char>::~allocator(&local_5d69);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5d90,"--gtest_file_location=gcc",&local_5d91);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5d90);
                      std::__cxx11::string::~string((string *)&local_5d90);
                      std::allocator<char>::~allocator(&local_5d91);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5db8,"--gtest_random_seed=200",&local_5db9);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5db8);
                      std::__cxx11::string::~string((string *)&local_5db8);
                      std::allocator<char>::~allocator(&local_5db9);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5de0,"--gtest_repeat=2",&local_5de1);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5de0);
                      std::__cxx11::string::~string((string *)&local_5de0);
                      std::allocator<char>::~allocator(&local_5de1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5e08,"--gtest_filter=Flag*",&local_5e09);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5e08);
                      std::__cxx11::string::~string((string *)&local_5e08);
                      std::allocator<char>::~allocator(&local_5e09);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5e30,"--iutest_default_package_name=",
                                 (allocator<char> *)&iutest_ar_44.field_0x27);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_5c58,&local_5e30);
                      std::__cxx11::string::~string((string *)&local_5e30);
                      std::allocator<char>::~allocator((allocator<char> *)&iutest_ar_44.field_0x27);
                      iutest::InitIrisUnitTest<char>
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_5c58);
                      iutest::detail::AlwaysZero();
                      local_5e64[0] = '\0';
                      local_5e64[1] = '\0';
                      local_5e64[2] = '\0';
                      local_5e64[3] = '\0';
                      local_5e70 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_5c58);
                      pRVar10 = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
                      iutest::internal::backward::EqHelper<true>::
                      Compare<unsigned_int,unsigned_long>
                                ((AssertionResult *)local_5e60,(EqHelper<true> *)0x1586ce,
                                 "vargv.size()",local_5e64,(uint *)&local_5e70,
                                 &iutest_type_traits::enabler_t<void>::value,
                                 in_stack_ffffffffffff71b8);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_5e60);
                      if (!bVar1) {
                        memset(&local_5ff8,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_5ff8);
                        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_5e60);
                        iutest::AssertionHelper::AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_45.m_result,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xd7,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&iutest_ar_45.m_result,&local_5ff8);
                        iutest::AssertionHelper::~AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_45.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_5ff8);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5e60);
                      iutest::detail::AlwaysZero();
                      iutest::TestFlag::Fragment<2>::Fragment((Fragment<2> *)&local_6051);
                      iutest::AssertionResult::Is<iutest::TestFlag::Fragment<2>>
                                ((AssertionResult *)local_6050,(AssertionResult *)&local_6051,b_08);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6050);
                      if (!bVar1) {
                        memset(&local_61e0,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_61e0);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)&iutest_ar_46.m_result,(internal *)local_6050,
                                   (AssertionResult *)"IUTEST_FLAG_GET(also_run_disabled_tests)",
                                   "false","true",(char *)pRVar10);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_6210,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xd9,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_6210,&local_61e0);
                        iutest::AssertionHelper::~AssertionHelper(&local_6210);
                        std::__cxx11::string::~string((string *)&iutest_ar_46.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_61e0);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6050);
                      iutest::detail::AlwaysZero();
                      iutest::TestFlag::Fragment<16>::Fragment((Fragment<16> *)&local_6259);
                      iutest::AssertionResult::Is<iutest::TestFlag::Fragment<16>>
                                ((AssertionResult *)local_6258,(AssertionResult *)&local_6259,b_09);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6258);
                      if (!bVar1) {
                        memset(&local_63e8,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_63e8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)&iutest_ar_47.m_result,(internal *)local_6258,
                                   (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false",
                                   "true",(char *)pRVar10);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_6418,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xda,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_6418,&local_63e8);
                        iutest::AssertionHelper::~AssertionHelper(&local_6418);
                        std::__cxx11::string::~string((string *)&iutest_ar_47.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_63e8);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6258);
                      iutest::detail::AlwaysZero();
                      iutest::TestFlag::Fragment<64>::Fragment((Fragment<64> *)&local_6461);
                      iutest::AssertionResult::Is<iutest::TestFlag::Fragment<64>>
                                ((AssertionResult *)local_6460,(AssertionResult *)&local_6461,b_10);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6460);
                      if (!bVar1) {
                        memset(&local_65f0,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_65f0);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)&iutest_ar_48.m_result,(internal *)local_6460,
                                   (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false",
                                   "true",(char *)pRVar10);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_6620,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdb,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_6620,&local_65f0);
                        iutest::AssertionHelper::~AssertionHelper(&local_6620);
                        std::__cxx11::string::~string((string *)&iutest_ar_48.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_65f0);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6460);
                      iutest::detail::AlwaysZero();
                      iutest::TestFlag::Fragment<196608>::Fragment((Fragment<196608> *)&local_6669);
                      iutest::AssertionResult::Is<iutest::TestFlag::Fragment<196608>>
                                ((AssertionResult *)local_6668,(AssertionResult *)&local_6669,b_11);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6668);
                      if (!bVar1) {
                        memset(&local_67f8,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_67f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)&iutest_ar_49.m_result,(internal *)local_6668,
                                   (AssertionResult *)"IUTEST_FLAG_GET(catch_exceptions)","false",
                                   "true",(char *)pRVar10);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_6828,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdc,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_6828,&local_67f8);
                        iutest::AssertionHelper::~AssertionHelper(&local_6828);
                        std::__cxx11::string::~string((string *)&iutest_ar_49.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_67f8);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6668);
                      iutest::detail::AlwaysZero();
                      iutest::TestFlag::Fragment<4096>::Fragment(&local_6872);
                      bVar1 = iutest::TestFlag::Fragment::operator_cast_to_bool
                                        ((Fragment *)&local_6872);
                      local_6871 = (bool)(~bVar1 & 1);
                      iutest::AssertionResult::Is<bool>((AssertionResult *)local_6870,&local_6871);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6870);
                      if (!bVar1) {
                        memset(&local_6a00,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_6a00);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)&iutest_ar_50.m_result,(internal *)local_6870,
                                   (AssertionResult *)"IUTEST_FLAG_GET(print_time)","true","false",
                                   (char *)pRVar10);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_6a30,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdd,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_6a30,&local_6a00);
                        iutest::AssertionHelper::~AssertionHelper(&local_6a30);
                        std::__cxx11::string::~string((string *)&iutest_ar_50.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_6a00);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6870);
                      iutest::detail::AlwaysZero();
                      iutest::TestFlag::Fragment<1>::Fragment((Fragment<1> *)&local_6a79);
                      iutest::AssertionResult::Is<iutest::TestFlag::Fragment<1>>
                                ((AssertionResult *)local_6a78,(AssertionResult *)&local_6a79,b_12);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6a78);
                      if (!bVar1) {
                        memset(&local_6c08,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_6c08);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)&iutest_ar_51.m_result,(internal *)local_6a78,
                                   (AssertionResult *)"IUTEST_FLAG_GET(shuffle)","false","true",
                                   (char *)pRVar10);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_6c38,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xde,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_6c38,&local_6c08);
                        iutest::AssertionHelper::~AssertionHelper(&local_6c38);
                        std::__cxx11::string::~string((string *)&iutest_ar_51.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_6c08);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6a78);
                      iutest::detail::AlwaysZero();
                      iutest::TestFlag::Fragment<8192>::Fragment(&local_6c82);
                      bVar1 = iutest::TestFlag::Fragment::operator_cast_to_bool
                                        ((Fragment *)&local_6c82);
                      local_6c81 = (bool)(~bVar1 & 1);
                      iutest::AssertionResult::Is<bool>((AssertionResult *)local_6c80,&local_6c81);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6c80);
                      if (!bVar1) {
                        memset(&local_6e10,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_6e10);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)&iutest_ar_52.m_result,(internal *)local_6c80,
                                   (AssertionResult *)"IUTEST_FLAG_GET(file_location_style_msvc)",
                                   "true","false",(char *)pRVar10);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_6e40,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xdf,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_6e40,&local_6e10);
                        iutest::AssertionHelper::~AssertionHelper(&local_6e40);
                        std::__cxx11::string::~string((string *)&iutest_ar_52.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_6e10);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6c80);
                      iutest::detail::AlwaysZero();
                      local_6e8c[0] = -0x38;
                      local_6e8c[1] = '\0';
                      local_6e8c[2] = '\0';
                      local_6e8c[3] = '\0';
                      iutest::TestEnv::RandomSeedSet::RandomSeedSet(&local_6e8d);
                      iutest::internal::backward::EqHelper<false>::
                      Compare<unsigned_int,iutest::TestEnv::RandomSeedSet>
                                ((AssertionResult *)local_6e88,(EqHelper<false> *)"200u",
                                 "::iutest::TestEnv::random_seed()",local_6e8c,(uint *)&local_6e8d,
                                 (RandomSeedSet *)pRVar10);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6e88);
                      if (!bVar1) {
                        memset(&local_7018,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_7018);
                        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_6e88);
                        iutest::AssertionHelper::AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_53.m_result,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe1,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&iutest_ar_53.m_result,&local_7018);
                        iutest::AssertionHelper::~AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_53.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_7018);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6e88);
                      iutest::detail::AlwaysZero();
                      local_7074[0] = '\x02';
                      local_7074[1] = '\0';
                      local_7074[2] = '\0';
                      local_7074[3] = '\0';
                      iutest::TestEnv::RepeatCountSet::RepeatCountSet(&local_7075);
                      iutest::internal::backward::EqHelper<false>::
                      Compare<int,iutest::TestEnv::RepeatCountSet>
                                ((AssertionResult *)local_7070,(EqHelper<false> *)0x158906,
                                 "::iutest::TestEnv::repeat()",local_7074,(int *)&local_7075,pRVar10
                                );
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_7070);
                      if (!bVar1) {
                        memset(&local_7200,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_7200);
                        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_7070);
                        iutest::AssertionHelper::AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_54.m_result,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe2,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&iutest_ar_54.m_result,&local_7200);
                        iutest::AssertionHelper::~AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_54.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_7200);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7070);
                      iutest::detail::AlwaysZero();
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                      ::OptionString(&local_7278);
                      pcVar4 = iutest::TestEnv::
                               OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                               ::c_str(&local_7278);
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                ((AssertionResult *)local_7258,(internal *)"\"ansi\"",
                                 "::iutest::TestEnv::color().c_str()","ansi",pcVar4,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_ffffffffffff71b8);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                      ::~OptionString(&local_7278);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_7258);
                      if (!bVar1) {
                        memset(&local_7400,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_7400);
                        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_7258);
                        iutest::AssertionHelper::AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_55.m_result,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe4,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&iutest_ar_55.m_result,&local_7400);
                        iutest::AssertionHelper::~AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_55.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_7400);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7258);
                      iutest::detail::AlwaysZero();
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::OptionString(&local_7478);
                      pcVar4 = iutest::TestEnv::
                               OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                               ::c_str(&local_7478);
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                ((AssertionResult *)local_7458,(internal *)"\"Flag*\"",
                                 "::iutest::TestEnv::filter().c_str()","Flag*",pcVar4,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_ffffffffffff71b8);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::~OptionString(&local_7478);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_7458);
                      if (!bVar1) {
                        memset(&local_7600,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_7600);
                        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_7458);
                        iutest::AssertionHelper::AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_56.m_result,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe5,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&iutest_ar_56.m_result,&local_7600);
                        iutest::AssertionHelper::~AssertionHelper
                                  ((AssertionHelper *)&iutest_ar_56.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_7600);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7458);
                      iutest::detail::AlwaysZero();
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                      ::OptionString(&local_7678);
                      pcVar4 = iutest::TestEnv::
                               OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                               ::c_str(&local_7678);
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                ((AssertionResult *)local_7658,(internal *)"\"\"",
                                 "::iutest::TestEnv::default_package_name().c_str()","",pcVar4,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_ffffffffffff71b8);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                      ::~OptionString(&local_7678);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_7658);
                      if (!bVar1) {
                        memset(&local_7800,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_7800);
                        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_7658);
                        iutest::AssertionHelper::AssertionHelper
                                  (&local_7830,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                   ,0xe6,pcVar4,kNonFatalFailure);
                        iutest::AssertionHelper::operator=(&local_7830,&local_7800);
                        iutest::AssertionHelper::~AssertionHelper(&local_7830);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_7800);
                      }
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7658);
                      pUVar8 = iutest::UnitTest::GetInstance();
                      bVar1 = iutest::UnitTest::Failed(pUVar8);
                      if (bVar1) {
                        argv_local._4_4_ = 1;
                      }
                      else {
                        pRVar10 = (RepeatCountSet *)
                                  ((long)&vargv_4.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                        iutest::TestEnv::RepeatCountSet::RepeatCountSet(pRVar10);
                        iutest::TestEnv::RepeatCountSet::operator=(pRVar10,1);
                      }
                      iutest_ar_15._37_3_ = 0;
                      iutest_ar_15._36_1_ = bVar1;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_5c58);
                      if (iutest_ar_15._36_4_ == 0) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_7850);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_7870,"--iutest_color=off",
                                   (allocator<char> *)&iutest_ar_57.field_0x27);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_7850,&local_7870);
                        std::__cxx11::string::~string((string *)&local_7870);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)&iutest_ar_57.field_0x27);
                        iutest::InitIrisUnitTest<char>
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_7850);
                        iutest::detail::AlwaysZero();
                        local_78a4[0] = '\0';
                        local_78a4[1] = '\0';
                        local_78a4[2] = '\0';
                        local_78a4[3] = '\0';
                        local_78b0 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_7850);
                        iutest::internal::backward::EqHelper<true>::
                        Compare<unsigned_int,unsigned_long>
                                  ((AssertionResult *)local_78a0,(EqHelper<true> *)0x1586ce,
                                   "vargv.size()",local_78a4,(uint *)&local_78b0,
                                   &iutest_type_traits::enabler_t<void>::value,
                                   in_stack_ffffffffffff71b8);
                        bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_78a0);
                        if (!bVar1) {
                          memset(&local_7a38,0,0x188);
                          iutest::AssertionHelper::Fixed::Fixed(&local_7a38);
                          pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_78a0);
                          iutest::AssertionHelper::AssertionHelper
                                    ((AssertionHelper *)&iutest_ar_58.m_result,
                                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                     ,0xf1,pcVar4,kNonFatalFailure);
                          iutest::AssertionHelper::operator=
                                    ((AssertionHelper *)&iutest_ar_58.m_result,&local_7a38);
                          iutest::AssertionHelper::~AssertionHelper
                                    ((AssertionHelper *)&iutest_ar_58.m_result);
                          iutest::AssertionHelper::Fixed::~Fixed(&local_7a38);
                        }
                        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_78a0);
                        iutest::detail::AlwaysZero();
                        iutest::TestEnv::
                        OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                        ::OptionString(&local_7ab0);
                        pcVar4 = iutest::TestEnv::
                                 OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                 ::c_str(&local_7ab0);
                        iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                  ((AssertionResult *)local_7a90,(internal *)"\"no\"",
                                   "::iutest::TestEnv::color().c_str()","no",pcVar4,
                                   (char *)&iutest_type_traits::enabler_t<void>::value,
                                   in_stack_ffffffffffff71b8);
                        iutest::TestEnv::
                        OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                        ::~OptionString(&local_7ab0);
                        bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_7a90);
                        if (!bVar1) {
                          memset(&local_7c38,0,0x188);
                          iutest::AssertionHelper::Fixed::Fixed(&local_7c38);
                          pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_7a90);
                          iutest::AssertionHelper::AssertionHelper
                                    ((AssertionHelper *)
                                     &vargv_5.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                     ,0xf2,pcVar4,kNonFatalFailure);
                          iutest::AssertionHelper::operator=
                                    ((AssertionHelper *)
                                     &vargv_5.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_7c38
                                    );
                          iutest::AssertionHelper::~AssertionHelper
                                    ((AssertionHelper *)
                                     &vargv_5.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          iutest::AssertionHelper::Fixed::~Fixed(&local_7c38);
                        }
                        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7a90);
                        pUVar5 = iutest::UnitTestSource::GetInstance();
                        iVar3 = iutest::UnitTestSource::Run(pUVar5);
                        if (iVar3 != 0) {
                          argv_local._4_4_ = 1;
                        }
                        iutest_ar_15._37_3_ = 0;
                        iutest_ar_15._36_1_ = iVar3 != 0;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_7850);
                        if (iutest_ar_15._36_4_ == 0) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_7c80);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_7ca0,"--iutest_color=1",
                                     (allocator<char> *)&iutest_ar_59.field_0x27);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_7c80,&local_7ca0);
                          std::__cxx11::string::~string((string *)&local_7ca0);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)&iutest_ar_59.field_0x27);
                          iutest::InitIrisUnitTest<char>
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_7c80);
                          iutest::detail::AlwaysZero();
                          local_7cd4[0] = '\0';
                          local_7cd4[1] = '\0';
                          local_7cd4[2] = '\0';
                          local_7cd4[3] = '\0';
                          local_7ce0 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_7c80);
                          iutest::internal::backward::EqHelper<true>::
                          Compare<unsigned_int,unsigned_long>
                                    ((AssertionResult *)local_7cd0,(EqHelper<true> *)0x1586ce,
                                     "vargv.size()",local_7cd4,(uint *)&local_7ce0,
                                     &iutest_type_traits::enabler_t<void>::value,
                                     in_stack_ffffffffffff71b8);
                          bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_7cd0);
                          if (!bVar1) {
                            memset(&local_7e68,0,0x188);
                            iutest::AssertionHelper::Fixed::Fixed(&local_7e68);
                            pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_7cd0)
                            ;
                            iutest::AssertionHelper::AssertionHelper
                                      ((AssertionHelper *)&iutest_ar_60.m_result,
                                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                       ,0xfa,pcVar4,kNonFatalFailure);
                            iutest::AssertionHelper::operator=
                                      ((AssertionHelper *)&iutest_ar_60.m_result,&local_7e68);
                            iutest::AssertionHelper::~AssertionHelper
                                      ((AssertionHelper *)&iutest_ar_60.m_result);
                            iutest::AssertionHelper::Fixed::~Fixed(&local_7e68);
                          }
                          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7cd0);
                          iutest::detail::AlwaysZero();
                          iutest::TestEnv::
                          OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                          ::OptionString(&local_7ee0);
                          pcVar4 = iutest::TestEnv::
                                   OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                   ::c_str(&local_7ee0);
                          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                    ((AssertionResult *)local_7ec0,(internal *)"\"yes\"",
                                     "::iutest::TestEnv::color().c_str()","yes",pcVar4,
                                     (char *)&iutest_type_traits::enabler_t<void>::value,
                                     in_stack_ffffffffffff71b8);
                          iutest::TestEnv::
                          OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                          ::~OptionString(&local_7ee0);
                          bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_7ec0);
                          if (!bVar1) {
                            memset(&local_8068,0,0x188);
                            iutest::AssertionHelper::Fixed::Fixed(&local_8068);
                            pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_7ec0)
                            ;
                            iutest::AssertionHelper::AssertionHelper
                                      ((AssertionHelper *)
                                       &vargv_6.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                       ,0xfb,pcVar4,kNonFatalFailure);
                            iutest::AssertionHelper::operator=
                                      ((AssertionHelper *)
                                       &vargv_6.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       &local_8068);
                            iutest::AssertionHelper::~AssertionHelper
                                      ((AssertionHelper *)
                                       &vargv_6.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            iutest::AssertionHelper::Fixed::~Fixed(&local_8068);
                          }
                          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7ec0);
                          pUVar5 = iutest::UnitTestSource::GetInstance();
                          iVar3 = iutest::UnitTestSource::Run(pUVar5);
                          if (iVar3 != 0) {
                            argv_local._4_4_ = 1;
                          }
                          iutest_ar_15._37_3_ = 0;
                          iutest_ar_15._36_1_ = iVar3 != 0;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_7c80);
                          if (iutest_ar_15._36_4_ == 0) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_80b0);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_80d0,"--iutest_color=auto",
                                       (allocator<char> *)&iutest_ar_61.field_0x27);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_80b0,&local_80d0);
                            std::__cxx11::string::~string((string *)&local_80d0);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)&iutest_ar_61.field_0x27);
                            iutest::InitIrisUnitTest<char>
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_80b0);
                            iutest::detail::AlwaysZero();
                            local_8104[0] = '\0';
                            local_8104[1] = '\0';
                            local_8104[2] = '\0';
                            local_8104[3] = '\0';
                            local_8110 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_80b0);
                            iutest::internal::backward::EqHelper<true>::
                            Compare<unsigned_int,unsigned_long>
                                      ((AssertionResult *)local_8100,(EqHelper<true> *)0x1586ce,
                                       "vargv.size()",local_8104,(uint *)&local_8110,
                                       &iutest_type_traits::enabler_t<void>::value,
                                       in_stack_ffffffffffff71b8);
                            bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_8100);
                            if (!bVar1) {
                              memset(&local_8298,0,0x188);
                              iutest::AssertionHelper::Fixed::Fixed(&local_8298);
                              pcVar4 = iutest::AssertionResult::message
                                                 ((AssertionResult *)local_8100);
                              iutest::AssertionHelper::AssertionHelper
                                        ((AssertionHelper *)&iutest_ar_62.m_result,
                                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                         ,0x103,pcVar4,kNonFatalFailure);
                              iutest::AssertionHelper::operator=
                                        ((AssertionHelper *)&iutest_ar_62.m_result,&local_8298);
                              iutest::AssertionHelper::~AssertionHelper
                                        ((AssertionHelper *)&iutest_ar_62.m_result);
                              iutest::AssertionHelper::Fixed::~Fixed(&local_8298);
                            }
                            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8100)
                            ;
                            iutest::detail::AlwaysZero();
                            iutest::TestEnv::
                            OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                            ::OptionString(&local_8310);
                            pcVar4 = iutest::TestEnv::
                                     OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                     ::c_str(&local_8310);
                            iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                      ((AssertionResult *)local_82f0,(internal *)"\"auto\"",
                                       "::iutest::TestEnv::color().c_str()","auto",pcVar4,
                                       (char *)&iutest_type_traits::enabler_t<void>::value,
                                       in_stack_ffffffffffff71b8);
                            iutest::TestEnv::
                            OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                            ::~OptionString(&local_8310);
                            bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_82f0);
                            if (!bVar1) {
                              memset(&local_8498,0,0x188);
                              iutest::AssertionHelper::Fixed::Fixed(&local_8498);
                              pcVar4 = iutest::AssertionResult::message
                                                 ((AssertionResult *)local_82f0);
                              iutest::AssertionHelper::AssertionHelper
                                        (&local_84c8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                                         ,0x104,pcVar4,kNonFatalFailure);
                              iutest::AssertionHelper::operator=(&local_84c8,&local_8498);
                              iutest::AssertionHelper::~AssertionHelper(&local_84c8);
                              iutest::AssertionHelper::Fixed::~Fixed(&local_8498);
                            }
                            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_82f0)
                            ;
                            pUVar5 = iutest::UnitTestSource::GetInstance();
                            iVar3 = iutest::UnitTestSource::Run(pUVar5);
                            if (iVar3 != 0) {
                              argv_local._4_4_ = 1;
                            }
                            iutest_ar_15._37_3_ = 0;
                            iutest_ar_15._36_1_ = iVar3 != 0;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_80b0);
                            if (iutest_ar_15._36_4_ == 0) {
                              printf("*** Successful ***\n");
                              argv_local._4_4_ = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  argv_local._4_4_ = 1;
                }
              }
              else {
                argv_local._4_4_ = 1;
              }
            }
          }
          else {
            argv_local._4_4_ = 1;
          }
        }
        else {
          argv_local._4_4_ = 1;
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

#if !defined(IUTEST_USE_GTEST) && IUTEST_HAS_NULLPTR
    {
        int targc = 0;
        IUTEST_INIT(&targc, nullptr);
    }
#endif

    {
        int targc = 2;
        DECAL_ARGV("--help");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#if !defined(IUTEST_USE_GTEST)
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));

        int targc = 2;
        DECAL_ARGV("--version");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        IUTEST_EXPECT_NE( "no", IUTEST_FLAG_GET(color) );
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        int targc = 2;
        DECAL_ARGV("--feature");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));

        int targc = 2;
        DECAL_ARGV("--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        int targc = 4;
        const iutest::detail::iu_tchar* targv[] = { argv[0], IU_TSTR("test1"), IU_TSTR("-v"), IU_TSTR("test2") };
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(3, targc);
        IUTEST_EXPECT_STREQ(IU_TSTR("test1"), targv[1]);
        IUTEST_EXPECT_STREQ(IU_TSTR("test2"), targv[2]);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("test1");
        vargv.push_back("-v");
        vargv.push_back("test2");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(2u, vargv.size());
        IUTEST_EXPECT_STREQ("test1", vargv[0]);
        IUTEST_EXPECT_STREQ("test2", vargv[1]);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }

    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        int targc = 2;
        DECAL_ARGV("-h");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));

        int targc = 2;
        DECAL_ARGV("-?");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }

    {
        const bool file_location_msvc = IUTEST_FLAG_GET(file_location_style_msvc);
        IUTEST_FLAG_SET(file_location_style_msvc, !file_location_msvc);

        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_break_on_failure");
        vargv.push_back("--iutest_throw_on_failure");
        vargv.push_back("--iutest_filter");
        vargv.push_back("--iutest_file_location=auto");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_STREQ( "*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_EQ   ( file_location_msvc, IUTEST_FLAG_GET(file_location_style_msvc) );

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;
    }

    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_break_on_failure=1");
        vargv.push_back("--iutest_throw_on_failure=t");
        vargv.push_back("--iutest_also_run_disabled_tests");
        vargv.push_back("--iutest_catch_exceptions=yes");
        vargv.push_back("--iutest_print_time=n");
        vargv.push_back("--iutest_shuffle");
        vargv.push_back("--iutest_color=ansi");
        vargv.push_back("--iutest_file_location=vs");
        vargv.push_back("--iutest_random_seed=200");
        vargv.push_back("--iutest_repeat=2");
        vargv.push_back("--iutest_filter=Flag*");
        vargv.push_back("--iutest_default_package_name=root");
        vargv.push_back("--iutest_warning_into_error=t");
        vargv.push_back("--iutest_locale_ctype=C");
#if IUTEST_HAS_STREAM_RESULT
        vargv.push_back("--iutest_stream_result_to=test");
#endif
        vargv.push_back("--verbose");

        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(also_run_disabled_tests) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(catch_exceptions) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(print_time) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(shuffle) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(file_location_style_msvc) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(warning_into_error) );

        IUTEST_EXPECT_EQ( 200u, IUTEST_FLAG_GET(random_seed) );
        IUTEST_EXPECT_EQ(   2 , IUTEST_FLAG_GET(repeat) );

        IUTEST_EXPECT_STREQ( "ansi", IUTEST_FLAG_GET(color).c_str() );
        IUTEST_EXPECT_STREQ( "Flag*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_STREQ( "root", IUTEST_FLAG_GET(default_package_name).c_str() );
        IUTEST_EXPECT_STREQ( "C", IUTEST_FLAG_GET(locale_ctype).c_str() );
#if IUTEST_HAS_STREAM_RESULT
        IUTEST_EXPECT_STREQ( "test", IUTEST_FLAG_GET(stream_result_to).c_str() );
#endif
        IUTEST_EXPECT_TRUE (::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::VERBOSE));

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;
    }

    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--gtest_break_on_failure=1");
        vargv.push_back("--gtest_throw_on_failure=t");
        vargv.push_back("--gtest_also_run_disabled_tests");
        vargv.push_back("--gtest_catch_exceptions=yes");
        vargv.push_back("--gtest_print_time=n");
        vargv.push_back("--gtest_shuffle");
        vargv.push_back("--gtest_color=ansi");
        vargv.push_back("--gtest_file_location=gcc");
        vargv.push_back("--gtest_random_seed=200");
        vargv.push_back("--gtest_repeat=2");
        vargv.push_back("--gtest_filter=Flag*");
        vargv.push_back("--iutest_default_package_name=");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(also_run_disabled_tests) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(catch_exceptions) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(print_time) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(shuffle) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(file_location_style_msvc) );

        IUTEST_EXPECT_EQ( 200u, IUTEST_FLAG_GET(random_seed) );
        IUTEST_EXPECT_EQ(   2 , IUTEST_FLAG_GET(repeat) );

        IUTEST_EXPECT_STREQ( "ansi", IUTEST_FLAG_GET(color).c_str() );
        IUTEST_EXPECT_STREQ( "Flag*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_STREQ( "", IUTEST_FLAG_GET(default_package_name).c_str() );

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;

        IUTEST_FLAG_SET(repeat, 1);
    }

    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=off");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "no", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=1");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "yes", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=auto");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "auto", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}